

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O0

void heapify32b(float32 *a,uint32 *k,uint32 i,uint32 sz,hcmpfn32b_t cmp)

{
  uint32 uVar1;
  float32 fVar2;
  float32 fVar3;
  int iVar4;
  float32 t_a;
  uint32 t_k;
  uint32 b;
  uint32 r;
  uint32 l;
  hcmpfn32b_t cmp_local;
  uint32 sz_local;
  uint32 i_local;
  uint32 *k_local;
  float32 *a_local;
  
  fVar2 = (float32)(i * 2 + 1);
  fVar3 = (float32)(i * 2 + 2);
  t_a = (float32)i;
  if (((uint)fVar2 < sz) && (iVar4 = (*cmp)(a[(uint)fVar2],a[i]), iVar4 != 0)) {
    t_a = fVar2;
  }
  if (((uint)fVar3 < sz) && (iVar4 = (*cmp)(a[(uint)fVar3],a[(uint)t_a]), iVar4 != 0)) {
    t_a = fVar3;
  }
  if (t_a != (float32)i) {
    fVar2 = a[i];
    a[i] = a[(uint)t_a];
    a[(uint)t_a] = fVar2;
    uVar1 = k[i];
    k[i] = k[(uint)t_a];
    k[(uint)t_a] = uVar1;
    heapify32b(a,k,(uint32)t_a,sz,cmp);
  }
  return;
}

Assistant:

void
heapify32b(float32 *a, uint32 *k,
	    uint32 i,
	    uint32 sz,
	    hcmpfn32b_t cmp)
{
    uint32 l, r, b, t_k;
    float32 t_a;

    l = LEFT(i);
    r = RIGHT(i);

    /* Determine the "best" node of i, l or r */
    if ((l < sz) && cmp(a[l], a[i]))
	b = l;
    else
	b = i;

    if ((r < sz) && cmp(a[r], a[b]))
	b = r;

    /* If node i is not the first in the ordering,
     * then switch i with the left or right child that is first and
     * heapify the the tree rooted at the new node i position
     */
    if (b != i) {
	/* exchange the values... */
	t_a = a[i];
	a[i] = a[b];
	a[b] = t_a;

	/* ... and the keys */
	t_k = k[i];
	k[i] = k[b];
	k[b] = t_k;

	heapify32b(a, k, b, sz, cmp);
    }
}